

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpSetMaxSubscriptions(UpnpDevice_Handle Hnd,int MaxSubscriptions)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  int line;
  char *file;
  Handle_Info *SInfo;
  
  iVar2 = (int)&SInfo;
  SInfo = (Handle_Info *)0x0;
  if (UpnpSdkInit == 1) {
    line = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x845,"Inside UpnpSetMaxSubscriptions \n");
    HandleLock((char *)0x848,line);
    UVar1 = GetHandleInfo(Hnd,&SInfo);
    if (UVar1 == HND_DEVICE) {
      if (-2 < MaxSubscriptions) {
        SInfo->MaxSubscriptions = MaxSubscriptions;
        HandleUnlock((char *)0x855,iVar2);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x85a,"Exiting UpnpSetMaxSubscriptions \n"
                  );
        return 0;
      }
      file = (char *)0x851;
    }
    else {
      file = (char *)0x84d;
    }
    HandleUnlock(file,iVar2);
    iVar2 = -100;
  }
  else {
    iVar2 = -0x74;
  }
  return iVar2;
}

Assistant:

int UpnpSetMaxSubscriptions(UpnpDevice_Handle Hnd, int MaxSubscriptions)
{
	struct Handle_Info *SInfo = NULL;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSetMaxSubscriptions \n");

	HandleLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if ((MaxSubscriptions != UPNP_INFINITE) && (MaxSubscriptions < 0)) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	SInfo->MaxSubscriptions = MaxSubscriptions;
	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSetMaxSubscriptions \n");

	return UPNP_E_SUCCESS;
}